

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[21]>
          (Exception *this,char **args,char *args_1,int *args_2,char *args_3,int *args_4,
          char *args_5,char (*args_6) [21])

{
  ostringstream oss;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[21]>
            (this,(ostringstream *)local_1a8,args,args_1,args_2,args_3,args_4,args_5,args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void SetWhat(Args&&... args)
        {
            std::ostringstream oss;
            SetWhat(oss, std::forward<Args>(args)...);
            what_ = oss.str();
        }